

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O2

SoundFont * __thiscall sf2cute::SoundFont::operator=(SoundFont *this,SoundFont *origin)

{
  vector<std::shared_ptr<sf2cute::SFInstrument>,_std::allocator<std::shared_ptr<sf2cute::SFInstrument>_>_>
  *this_00;
  vector<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>
  *this_01;
  pointer psVar1;
  pointer psVar2;
  pointer psVar3;
  shared_ptr<sf2cute::SFInstrument> *instrument;
  pointer psVar4;
  pointer psVar5;
  pointer psVar6;
  
  std::
  vector<std::shared_ptr<sf2cute::SFPreset>,_std::allocator<std::shared_ptr<sf2cute::SFPreset>_>_>::
  clear(&this->presets_);
  std::
  vector<std::shared_ptr<sf2cute::SFPreset>,_std::allocator<std::shared_ptr<sf2cute::SFPreset>_>_>::
  reserve(&this->presets_,
          (long)(origin->presets_).
                super__Vector_base<std::shared_ptr<sf2cute::SFPreset>,_std::allocator<std::shared_ptr<sf2cute::SFPreset>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(origin->presets_).
                super__Vector_base<std::shared_ptr<sf2cute::SFPreset>,_std::allocator<std::shared_ptr<sf2cute::SFPreset>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 4);
  psVar1 = (origin->presets_).
           super__Vector_base<std::shared_ptr<sf2cute::SFPreset>,_std::allocator<std::shared_ptr<sf2cute::SFPreset>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar6 = (origin->presets_).
                super__Vector_base<std::shared_ptr<sf2cute::SFPreset>,_std::allocator<std::shared_ptr<sf2cute::SFPreset>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar6 != psVar1; psVar6 = psVar6 + 1) {
    std::make_shared<sf2cute::SFPreset,sf2cute::SFPreset&>((SFPreset *)&stack0xffffffffffffffc0);
    std::
    vector<std::shared_ptr<sf2cute::SFPreset>,std::allocator<std::shared_ptr<sf2cute::SFPreset>>>::
    emplace_back<std::shared_ptr<sf2cute::SFPreset>>
              ((vector<std::shared_ptr<sf2cute::SFPreset>,std::allocator<std::shared_ptr<sf2cute::SFPreset>>>
                *)this,(shared_ptr<sf2cute::SFPreset> *)&stack0xffffffffffffffc0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc8);
  }
  this_00 = &this->instruments_;
  std::
  vector<std::shared_ptr<sf2cute::SFInstrument>,_std::allocator<std::shared_ptr<sf2cute::SFInstrument>_>_>
  ::clear(this_00);
  std::
  vector<std::shared_ptr<sf2cute::SFInstrument>,_std::allocator<std::shared_ptr<sf2cute::SFInstrument>_>_>
  ::reserve(this_00,(long)(origin->instruments_).
                          super__Vector_base<std::shared_ptr<sf2cute::SFInstrument>,_std::allocator<std::shared_ptr<sf2cute::SFInstrument>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(origin->instruments_).
                          super__Vector_base<std::shared_ptr<sf2cute::SFInstrument>,_std::allocator<std::shared_ptr<sf2cute::SFInstrument>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 4);
  psVar2 = (origin->instruments_).
           super__Vector_base<std::shared_ptr<sf2cute::SFInstrument>,_std::allocator<std::shared_ptr<sf2cute::SFInstrument>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar4 = (origin->instruments_).
                super__Vector_base<std::shared_ptr<sf2cute::SFInstrument>,_std::allocator<std::shared_ptr<sf2cute::SFInstrument>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar4 != psVar2; psVar4 = psVar4 + 1) {
    std::make_shared<sf2cute::SFInstrument,sf2cute::SFInstrument&>
              ((SFInstrument *)&stack0xffffffffffffffc0);
    std::
    vector<std::shared_ptr<sf2cute::SFInstrument>,std::allocator<std::shared_ptr<sf2cute::SFInstrument>>>
    ::emplace_back<std::shared_ptr<sf2cute::SFInstrument>>
              ((vector<std::shared_ptr<sf2cute::SFInstrument>,std::allocator<std::shared_ptr<sf2cute::SFInstrument>>>
                *)this_00,(shared_ptr<sf2cute::SFInstrument> *)&stack0xffffffffffffffc0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc8);
  }
  this_01 = &this->samples_;
  std::
  vector<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>::
  clear(this_01);
  std::
  vector<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>::
  reserve(this_01,(long)(origin->samples_).
                        super__Vector_base<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(origin->samples_).
                        super__Vector_base<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4);
  psVar3 = (origin->samples_).
           super__Vector_base<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar5 = (origin->samples_).
                super__Vector_base<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar5 != psVar3; psVar5 = psVar5 + 1) {
    std::make_shared<sf2cute::SFSample,sf2cute::SFSample&>((SFSample *)&stack0xffffffffffffffc0);
    std::
    vector<std::shared_ptr<sf2cute::SFSample>,std::allocator<std::shared_ptr<sf2cute::SFSample>>>::
    emplace_back<std::shared_ptr<sf2cute::SFSample>>
              ((vector<std::shared_ptr<sf2cute::SFSample>,std::allocator<std::shared_ptr<sf2cute::SFSample>>>
                *)this_01,(shared_ptr<sf2cute::SFSample> *)&stack0xffffffffffffffc0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc8);
  }
  std::__cxx11::string::_M_assign((string *)&this->sound_engine_);
  std::__cxx11::string::_M_assign((string *)&this->bank_name_);
  std::__cxx11::string::_M_assign((string *)&this->rom_name_);
  this->rom_version_ = origin->rom_version_;
  this->has_rom_version_ = origin->has_rom_version_;
  std::__cxx11::string::_M_assign((string *)&this->creation_date_);
  std::__cxx11::string::_M_assign((string *)&this->engineers_);
  std::__cxx11::string::_M_assign((string *)&this->product_);
  std::__cxx11::string::_M_assign((string *)&this->copyright_);
  std::__cxx11::string::_M_assign((string *)&this->comment_);
  std::__cxx11::string::_M_assign((string *)&this->software_);
  SetBackwardReferences(this);
  RepairReferences(this,origin);
  return this;
}

Assistant:

SoundFont & SoundFont::operator=(const SoundFont & origin) {
  // Copy presets.
  presets_.clear();
  presets_.reserve(origin.presets().size());
  for (const auto & preset : origin.presets()) {
    presets_.push_back(std::make_shared<SFPreset>(*preset));
  }

  // Copy instruments.
  instruments_.clear();
  instruments_.reserve(origin.instruments().size());
  for (const auto & instrument : origin.instruments()) {
    instruments_.push_back(std::make_shared<SFInstrument>(*instrument));
  }

  // Copy samples.
  samples_.clear();
  samples_.reserve(origin.samples().size());
  for (const auto & sample : origin.samples()) {
    samples_.push_back(std::make_shared<SFSample>(*sample));
  }

  // Copy other fields.
  sound_engine_ = origin.sound_engine_;
  bank_name_ = origin.bank_name_;
  rom_name_ = origin.rom_name_;
  rom_version_ = origin.rom_version_;
  has_rom_version_ = origin.has_rom_version_;
  creation_date_ = origin.creation_date_;
  engineers_ = origin.engineers_;
  product_ = origin.product_;
  copyright_ = origin.copyright_;
  comment_ = origin.comment_;
  software_ = origin.software_;

  // Repair references.
  SetBackwardReferences();
  RepairReferences(origin);

  return *this;
}